

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stty.c
# Opt level: O1

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  sexp_conflict psVar6;
  sexp_conflict op;
  sexp_conflict tmp;
  long local_78;
  sexp_conflict name;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  
  name = (sexp_conflict)0x43e;
  __sexp_gc_preserver1.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver1.next = (sexp_gc_var_t *)0x0;
  tmp = (sexp_conflict)0x43e;
  __sexp_gc_preserver2.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver2.next = (sexp_gc_var_t *)0x0;
  op = (sexp_conflict)0x43e;
  __sexp_gc_preserver3.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver3.next = (sexp_gc_var_t *)0x0;
  iVar1 = strcmp(version,"0.11.0");
  psVar6 = (sexp_conflict)0xb3e;
  if (iVar1 == 0) {
    iVar1 = strncmp(abi,"cv-gm*uh",8);
    if (iVar1 == 0) {
      __sexp_gc_preserver1.var = &name;
      __sexp_gc_preserver2.next = &__sexp_gc_preserver1;
      __sexp_gc_preserver1.next = (ctx->value).context.saves;
      (ctx->value).context.saves = __sexp_gc_preserver2.next;
      __sexp_gc_preserver2.var = &tmp;
      __sexp_gc_preserver3.next = &__sexp_gc_preserver2;
      (ctx->value).context.saves = __sexp_gc_preserver3.next;
      (ctx->value).context.saves = &__sexp_gc_preserver3;
      __sexp_gc_preserver3.var = &op;
      psVar6 = (sexp_conflict)sexp_intern(ctx,"VREPRINT",8);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0xc,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"VLNEXT",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0xf,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"VSTOP",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,9,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"VSTART",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,8,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"VSUSP",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,10,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"VQUIT",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"VKILL",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,3,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"VINTR",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"VWERASE",7);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0xe,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"VERASE",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,2,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"VEOL2",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x10,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"VEOL",4);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0xb,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"VEOF",4);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,4,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"NOFLSH",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x80,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"FLUSHO",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x1000,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"TOSTOP",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x100,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"IEXTEN",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x8000,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"ICANON",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,2,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"ISIG",4);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"ECHOCTL",7);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x200,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"ECHONL",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x40,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"ECHO",4);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,8,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"ECHOE",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x10,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"ECHOKE",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x800,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"CRTSCTS",7);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x80000000,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"CLOCAL",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x800,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"HUPCL",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x400,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"PARODD",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x200,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"PARENB",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x100,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"CREAD",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x80,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"CSTOPB",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x40,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"CS8",3);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x30,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"CS7",3);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x20,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"CS6",3);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x10,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"CS5",3);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"CSIZE",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x30,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"ONLRET",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x20,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"ONOCR",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x10,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"OCRNL",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,8,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"ONLCR",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,4,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"OPOST",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"IMAXBEL",7);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x2000,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"IXANY",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x800,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"IXOFF",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x1000,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"IXON",4);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x400,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"ICRNL",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x100,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"IGNCR",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x80,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"INLCR",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x40,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"ISTRIP",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x20,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"INPCK",5);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,0x10,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"PARMRK",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,8,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"IGNPAR",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,4,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"BRKINT",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,2,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"IGNBRK",6);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_unsigned_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"TCSAFLUSH",9);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_integer(ctx,2,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"TCSADRAIN",9);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_integer(ctx,1,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"TCSANOW",7);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      psVar6 = (sexp_conflict)sexp_intern(ctx,"TIOCGWINSZ",10);
      name = psVar6;
      tmp = (sexp_conflict)sexp_make_integer(ctx,0x5413,0);
      sexp_env_define(ctx,env,psVar6,tmp);
      name = (sexp_conflict)sexp_c_string(ctx,"winsize",0xffffffffffffffff);
      lVar2 = sexp_register_type_op
                        (ctx,0,0x12,name,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                         "sexp_finalize_c_type",sexp_finalize_c_type);
      tmp = (sexp_conflict)sexp_string_to_symbol_op(ctx,0,1,name);
      sexp_env_define(ctx,env,tmp,lVar2);
      *(undefined8 *)(lVar2 + 0x18) = 0x23e;
      uVar3 = sexp_intern(ctx,"ws_col",0xffffffffffffffff);
      sexp_push_op(ctx,lVar2 + 0x18,uVar3);
      uVar3 = sexp_intern(ctx,"ws_row",0xffffffffffffffff);
      sexp_push_op(ctx,lVar2 + 0x18,uVar3);
      uVar3 = sexp_make_vector_op(ctx,0,2,5,0x3e);
      *(undefined8 *)(lVar2 + 0x20) = uVar3;
      uVar3 = sexp_make_vector_op(ctx,0,2,5,0x3e);
      *(undefined8 *)(lVar2 + 0x28) = uVar3;
      local_78 = lVar2;
      tmp = (sexp_conflict)sexp_make_type_predicate_op(ctx,0,2,name,lVar2);
      name = (sexp_conflict)sexp_intern(ctx,"winsize?",8);
      sexp_env_define(ctx,env,name,tmp);
      name = (sexp_conflict)sexp_c_string(ctx,"termios",0xffffffffffffffff);
      lVar4 = sexp_register_type_op
                        (ctx,0,0x12,name,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                         "sexp_finalize_c_type",sexp_finalize_c_type);
      tmp = (sexp_conflict)sexp_string_to_symbol_op(ctx,0,1,name);
      sexp_env_define(ctx,env,tmp,lVar4);
      lVar2 = lVar4 + 0x18;
      *(undefined8 *)(lVar4 + 0x18) = 0x23e;
      uVar3 = sexp_intern(ctx,"c_lflag",0xffffffffffffffff);
      sexp_push_op(ctx,lVar2,uVar3);
      uVar3 = sexp_intern(ctx,"c_cflag",0xffffffffffffffff);
      sexp_push_op(ctx,lVar2,uVar3);
      uVar3 = sexp_intern(ctx,"c_oflag",0xffffffffffffffff);
      sexp_push_op(ctx,lVar2,uVar3);
      uVar3 = sexp_intern(ctx,"c_iflag",0xffffffffffffffff);
      sexp_push_op(ctx,lVar2,uVar3);
      uVar3 = sexp_make_vector_op(ctx,0,2,9,0x3e);
      *(undefined8 *)(lVar4 + 0x20) = uVar3;
      uVar3 = sexp_make_vector_op(ctx,0,2,9,0x3e);
      *(undefined8 *)(lVar4 + 0x28) = uVar3;
      tmp = (sexp_conflict)sexp_make_type_predicate_op(ctx,0,2,name,lVar4);
      name = (sexp_conflict)sexp_intern(ctx,"term-attrs?",0xb);
      sexp_env_define(ctx,env,name,tmp);
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"term-attrs-lflag-set!",2,0,"sexp_termios_set_c_lflag",
                      sexp_termios_set_c_lflag,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar4 + 0x50) * 2 + 1);
        (op->value).port.offset = 5;
      }
      piVar5 = *(int **)(lVar4 + 0x28);
      if ((((ulong)piVar5 & 3) == 0) && (*piVar5 == 10)) {
        *(sexp_conflict *)(piVar5 + 10) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"term-attrs-lflag",1,0,"sexp_termios_get_c_lflag",
                      sexp_termios_get_c_lflag,0);
      lVar2 = local_78;
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar4 + 0x50) * 2 + 1);
      }
      piVar5 = *(int **)(lVar4 + 0x20);
      if ((((ulong)piVar5 & 3) == 0) && (*piVar5 == 10)) {
        *(sexp_conflict *)(piVar5 + 10) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"term-attrs-cflag-set!",2,0,"sexp_termios_set_c_cflag",
                      sexp_termios_set_c_cflag,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar4 + 0x50) * 2 + 1);
        (op->value).port.offset = 5;
      }
      piVar5 = *(int **)(lVar4 + 0x28);
      if ((((ulong)piVar5 & 3) == 0) && (*piVar5 == 10)) {
        *(sexp_conflict *)(piVar5 + 8) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"term-attrs-cflag",1,0,"sexp_termios_get_c_cflag",
                      sexp_termios_get_c_cflag,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar4 + 0x50) * 2 + 1);
      }
      piVar5 = *(int **)(lVar4 + 0x20);
      if ((((ulong)piVar5 & 3) == 0) && (*piVar5 == 10)) {
        *(sexp_conflict *)(piVar5 + 8) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"term-attrs-oflag-set!",2,0,"sexp_termios_set_c_oflag",
                      sexp_termios_set_c_oflag,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar4 + 0x50) * 2 + 1);
        (op->value).port.offset = 5;
      }
      piVar5 = *(int **)(lVar4 + 0x28);
      if ((((ulong)piVar5 & 3) == 0) && (*piVar5 == 10)) {
        *(sexp_conflict *)(piVar5 + 6) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"term-attrs-oflag",1,0,"sexp_termios_get_c_oflag",
                      sexp_termios_get_c_oflag,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar4 + 0x50) * 2 + 1);
      }
      piVar5 = *(int **)(lVar4 + 0x20);
      if ((((ulong)piVar5 & 3) == 0) && (*piVar5 == 10)) {
        *(sexp_conflict *)(piVar5 + 6) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"term-attrs-iflag-set!",2,0,"sexp_termios_set_c_iflag",
                      sexp_termios_set_c_iflag,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar4 + 0x50) * 2 + 1);
        (op->value).port.offset = 5;
      }
      piVar5 = *(int **)(lVar4 + 0x28);
      if ((((ulong)piVar5 & 3) == 0) && (*piVar5 == 10)) {
        *(sexp_conflict *)(piVar5 + 4) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"term-attrs-iflag",1,0,"sexp_termios_get_c_iflag",
                      sexp_termios_get_c_iflag,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar4 + 0x50) * 2 + 1);
      }
      piVar5 = *(int **)(lVar4 + 0x20);
      if ((((ulong)piVar5 & 3) == 0) && (*piVar5 == 10)) {
        *(sexp_conflict *)(piVar5 + 4) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"make-term-attrs",0,0,"sexp_make_term_attrs_stub",
                      sexp_make_term_attrs_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).type.setters = (sexp)((ulong)*(uint *)(lVar4 + 0x50) * 2 + 1);
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"winsize-col",1,0,"sexp_winsize_get_ws_col",sexp_winsize_get_ws_col,0)
      ;
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
      }
      piVar5 = *(int **)(lVar2 + 0x20);
      if ((((ulong)piVar5 & 3) == 0) && (*piVar5 == 10)) {
        *(sexp_conflict *)(piVar5 + 6) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"winsize-row",1,0,"sexp_winsize_get_ws_row",sexp_winsize_get_ws_row,0)
      ;
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
      }
      piVar5 = *(int **)(lVar2 + 0x20);
      if ((((ulong)piVar5 & 3) == 0) && (*piVar5 == 10)) {
        *(sexp_conflict *)(piVar5 + 4) = op;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"make-winsize",2,0,"sexp_make_winsize_stub",sexp_make_winsize_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).type.setters = (sexp)((ulong)*(uint *)(lVar2 + 0x50) * 2 + 1);
        (op->value).type.id = (sexp)0x5;
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"set-terminal-attributes!",3,0,"sexp_set_terminal_attributes_x_stub",
                      sexp_set_terminal_attributes_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x1;
        (op->value).port.offset = 5;
        (op->value).port.line = (ulong)*(uint *)(lVar4 + 0x50) * 2 | 1;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"get-terminal-attributes",1,0,"sexp_get_terminal_attributes_stub",
                      sexp_get_terminal_attributes_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x1;
        (op->value).port.offset = (ulong)*(uint *)(lVar4 + 0x50) * 2 | 1;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux(ctx,env,"ioctl",2,0,"sexp_ioctl_stub",sexp_ioctl_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)0x1;
        (op->value).port.offset = 5;
        (op->value).port.line = (ulong)*(uint *)(lVar2 + 0x50) * 2 | 1;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"term-attrs-ospeed-set!",2,0,"sexp_term_attrs_ospeed_set_x_stub",
                      sexp_term_attrs_ospeed_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar4 + 0x50) * 2 + 1);
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"term-attrs-ispeed-set!",2,0,"sexp_term_attrs_ispeed_set_x_stub",
                      sexp_term_attrs_ispeed_set_x_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 1;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar4 + 0x50) * 2 + 1);
        (op->value).port.offset = 5;
      }
      op = (sexp_conflict)
           sexp_define_foreign_aux
                     (ctx,env,"term-attrs-ospeed",1,0,"sexp_term_attrs_ospeed_stub",
                      sexp_term_attrs_ospeed_stub,0);
      if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
        (op->value).bytecode.max_depth = 5;
        (op->value).type.id = (sexp)((ulong)*(uint *)(lVar4 + 0x50) * 2 + 1);
      }
      piVar5 = (int *)sexp_define_foreign_aux
                                (ctx,env,"term-attrs-ispeed",1,0,"sexp_term_attrs_ispeed_stub",
                                 sexp_term_attrs_ispeed_stub,0);
      if ((((ulong)piVar5 & 3) == 0) && (*piVar5 == 0x1b)) {
        piVar5[10] = 5;
        piVar5[0xb] = 0;
        *(ulong *)(piVar5 + 0xc) = (ulong)*(uint *)(lVar4 + 0x50) * 2 + 1;
      }
      (ctx->value).context.saves = __sexp_gc_preserver1.next;
      psVar6 = (sexp_conflict)0x43e;
    }
  }
  return psVar6;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp sexp_winsize_type_obj;
  sexp sexp_termios_type_obj;
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  name = sexp_intern(ctx, "VREPRINT", 8);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VREPRINT));
  name = sexp_intern(ctx, "VLNEXT", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VLNEXT));
  name = sexp_intern(ctx, "VSTOP", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VSTOP));
  name = sexp_intern(ctx, "VSTART", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VSTART));
  name = sexp_intern(ctx, "VSUSP", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VSUSP));
  name = sexp_intern(ctx, "VQUIT", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VQUIT));
  name = sexp_intern(ctx, "VKILL", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VKILL));
  name = sexp_intern(ctx, "VINTR", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VINTR));
  name = sexp_intern(ctx, "VWERASE", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VWERASE));
  name = sexp_intern(ctx, "VERASE", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VERASE));
  name = sexp_intern(ctx, "VEOL2", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VEOL2));
  name = sexp_intern(ctx, "VEOL", 4);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VEOL));
  name = sexp_intern(ctx, "VEOF", 4);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, VEOF));
  name = sexp_intern(ctx, "NOFLSH", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, NOFLSH));
  name = sexp_intern(ctx, "FLUSHO", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, FLUSHO));
  name = sexp_intern(ctx, "TOSTOP", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, TOSTOP));
  name = sexp_intern(ctx, "IEXTEN", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IEXTEN));
  name = sexp_intern(ctx, "ICANON", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ICANON));
  name = sexp_intern(ctx, "ISIG", 4);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ISIG));
  name = sexp_intern(ctx, "ECHOCTL", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ECHOCTL));
  name = sexp_intern(ctx, "ECHONL", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ECHONL));
  name = sexp_intern(ctx, "ECHO", 4);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ECHO));
  name = sexp_intern(ctx, "ECHOE", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ECHOE));
  name = sexp_intern(ctx, "ECHOKE", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ECHOKE));
  name = sexp_intern(ctx, "CRTSCTS", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CRTSCTS));
  name = sexp_intern(ctx, "CLOCAL", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CLOCAL));
  name = sexp_intern(ctx, "HUPCL", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, HUPCL));
  name = sexp_intern(ctx, "PARODD", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, PARODD));
  name = sexp_intern(ctx, "PARENB", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, PARENB));
  name = sexp_intern(ctx, "CREAD", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CREAD));
  name = sexp_intern(ctx, "CSTOPB", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CSTOPB));
  name = sexp_intern(ctx, "CS8", 3);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CS8));
  name = sexp_intern(ctx, "CS7", 3);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CS7));
  name = sexp_intern(ctx, "CS6", 3);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CS6));
  name = sexp_intern(ctx, "CS5", 3);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CS5));
  name = sexp_intern(ctx, "CSIZE", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, CSIZE));
  name = sexp_intern(ctx, "ONLRET", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ONLRET));
  name = sexp_intern(ctx, "ONOCR", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ONOCR));
  name = sexp_intern(ctx, "OCRNL", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, OCRNL));
  name = sexp_intern(ctx, "ONLCR", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ONLCR));
  name = sexp_intern(ctx, "OPOST", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, OPOST));
  name = sexp_intern(ctx, "IMAXBEL", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IMAXBEL));
  name = sexp_intern(ctx, "IXANY", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IXANY));
  name = sexp_intern(ctx, "IXOFF", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IXOFF));
  name = sexp_intern(ctx, "IXON", 4);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IXON));
  name = sexp_intern(ctx, "ICRNL", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ICRNL));
  name = sexp_intern(ctx, "IGNCR", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IGNCR));
  name = sexp_intern(ctx, "INLCR", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, INLCR));
  name = sexp_intern(ctx, "ISTRIP", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, ISTRIP));
  name = sexp_intern(ctx, "INPCK", 5);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, INPCK));
  name = sexp_intern(ctx, "PARMRK", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, PARMRK));
  name = sexp_intern(ctx, "IGNPAR", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IGNPAR));
  name = sexp_intern(ctx, "BRKINT", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, BRKINT));
  name = sexp_intern(ctx, "IGNBRK", 6);
  sexp_env_define(ctx, env, name, tmp=sexp_make_unsigned_integer(ctx, IGNBRK));
  name = sexp_intern(ctx, "TCSAFLUSH", 9);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, TCSAFLUSH));
  name = sexp_intern(ctx, "TCSADRAIN", 9);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, TCSADRAIN));
  name = sexp_intern(ctx, "TCSANOW", 7);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, TCSANOW));
  name = sexp_intern(ctx, "TIOCGWINSZ", 10);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, TIOCGWINSZ));
  name = sexp_c_string(ctx, "winsize", -1);
  sexp_winsize_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_winsize_type_obj);
  sexp_type_slots(sexp_winsize_type_obj) = SEXP_NULL;
  sexp_push(ctx, sexp_type_slots(sexp_winsize_type_obj), sexp_intern(ctx, "ws_col", -1));
  sexp_push(ctx, sexp_type_slots(sexp_winsize_type_obj), sexp_intern(ctx, "ws_row", -1));
  sexp_type_getters(sexp_winsize_type_obj) = sexp_make_vector(ctx, SEXP_TWO, SEXP_FALSE);
  sexp_type_setters(sexp_winsize_type_obj) = sexp_make_vector(ctx, SEXP_TWO, SEXP_FALSE);
  tmp = sexp_make_type_predicate(ctx, name, sexp_winsize_type_obj);
  name = sexp_intern(ctx, "winsize?", 8);
  sexp_env_define(ctx, env, name, tmp);
  name = sexp_c_string(ctx, "termios", -1);
  sexp_termios_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_termios_type_obj);
  sexp_type_slots(sexp_termios_type_obj) = SEXP_NULL;
  sexp_push(ctx, sexp_type_slots(sexp_termios_type_obj), sexp_intern(ctx, "c_lflag", -1));
  sexp_push(ctx, sexp_type_slots(sexp_termios_type_obj), sexp_intern(ctx, "c_cflag", -1));
  sexp_push(ctx, sexp_type_slots(sexp_termios_type_obj), sexp_intern(ctx, "c_oflag", -1));
  sexp_push(ctx, sexp_type_slots(sexp_termios_type_obj), sexp_intern(ctx, "c_iflag", -1));
  sexp_type_getters(sexp_termios_type_obj) = sexp_make_vector(ctx, SEXP_FOUR, SEXP_FALSE);
  sexp_type_setters(sexp_termios_type_obj) = sexp_make_vector(ctx, SEXP_FOUR, SEXP_FALSE);
  tmp = sexp_make_type_predicate(ctx, name, sexp_termios_type_obj);
  name = sexp_intern(ctx, "term-attrs?", 11);
  sexp_env_define(ctx, env, name, tmp);
  op = sexp_define_foreign(ctx, env, "term-attrs-lflag-set!", 2, sexp_termios_set_c_lflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  if (sexp_vectorp(sexp_type_setters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_setters(sexp_termios_type_obj), SEXP_THREE, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-lflag", 1, sexp_termios_get_c_lflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_getters(sexp_termios_type_obj), SEXP_THREE, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-cflag-set!", 2, sexp_termios_set_c_cflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  if (sexp_vectorp(sexp_type_setters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_setters(sexp_termios_type_obj), SEXP_TWO, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-cflag", 1, sexp_termios_get_c_cflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_getters(sexp_termios_type_obj), SEXP_TWO, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-oflag-set!", 2, sexp_termios_set_c_oflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  if (sexp_vectorp(sexp_type_setters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_setters(sexp_termios_type_obj), SEXP_ONE, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-oflag", 1, sexp_termios_get_c_oflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_getters(sexp_termios_type_obj), SEXP_ONE, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-iflag-set!", 2, sexp_termios_set_c_iflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  if (sexp_vectorp(sexp_type_setters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_setters(sexp_termios_type_obj), SEXP_ZERO, op);
  op = sexp_define_foreign(ctx, env, "term-attrs-iflag", 1, sexp_termios_get_c_iflag);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_termios_type_obj))) sexp_vector_set(sexp_type_getters(sexp_termios_type_obj), SEXP_ZERO, op);
  op = sexp_define_foreign(ctx, env, "make-term-attrs", 0, sexp_make_term_attrs_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "winsize-col", 1, sexp_winsize_get_ws_col);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_winsize_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_winsize_type_obj))) sexp_vector_set(sexp_type_getters(sexp_winsize_type_obj), SEXP_ONE, op);
  op = sexp_define_foreign(ctx, env, "winsize-row", 1, sexp_winsize_get_ws_row);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_winsize_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_winsize_type_obj))) sexp_vector_set(sexp_type_getters(sexp_winsize_type_obj), SEXP_ZERO, op);
  op = sexp_define_foreign(ctx, env, "make-winsize", 2, sexp_make_winsize_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_winsize_type_obj));
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "set-terminal-attributes!", 3, sexp_set_terminal_attributes_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "get-terminal-attributes", 1, sexp_get_terminal_attributes_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "ioctl", 2, sexp_ioctl_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_winsize_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "term-attrs-ospeed-set!", 2, sexp_term_attrs_ospeed_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "term-attrs-ispeed-set!", 2, sexp_term_attrs_ispeed_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "term-attrs-ospeed", 1, sexp_term_attrs_ospeed_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "term-attrs-ispeed", 1, sexp_term_attrs_ispeed_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_termios_type_obj));
  }
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}